

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall amrex::StateData::printTimeInterval(StateData *this,ostream *os)

{
  ostream *poVar1;
  
  std::operator<<(os,'[');
  poVar1 = std::ostream::_M_insert<double>((this->old_time).start);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<double>((this->old_time).stop);
  std::operator<<(poVar1,"] [");
  poVar1 = std::ostream::_M_insert<double>((this->new_time).start);
  std::operator<<(poVar1,' ');
  poVar1 = std::ostream::_M_insert<double>((this->new_time).stop);
  poVar1 = std::operator<<(poVar1,']');
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void
StateData::printTimeInterval (std::ostream &os) const
{
    os << '['
       << old_time.start
       << ' '
       << old_time.stop
       << "] ["
       << new_time.start
       << ' '
       << new_time.stop
       << ']'
       << '\n';
}